

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsortxx.h
# Opt level: O2

void divsufsortxx::substring::
     merge_backward<char*,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
               (char *T,iterator PA,iterator buf,iterator first,iterator middle,iterator last,
               value_type depth)

{
  iterator first1;
  iterator first2;
  int iVar1;
  uint extraout_var;
  undefined4 extraout_var_00;
  int extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  pos_type pVar2;
  undefined4 extraout_var_04;
  int extraout_var_05;
  int extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  int extraout_var_09;
  int extraout_var_10;
  undefined4 extraout_var_11;
  int extraout_var_12;
  undefined4 extraout_var_13;
  int extraout_var_14;
  int extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  int extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  _func_int **pp_Var3;
  BitmapArray<long> *pBVar4;
  ulong uVar5;
  BitmapArray<long> *pBVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  iterator p1;
  iterator last1;
  iterator p2;
  BitmapArray<long> *in_stack_ffffffffffffff48;
  BitmapArray<long> *in_stack_ffffffffffffff50;
  value_reference local_a0;
  ulong local_90;
  ulong local_88;
  BitmapArray<long> *local_80;
  ulong local_78;
  pos_type local_70;
  BitmapArray<long> *local_68;
  pos_type local_60;
  undefined8 local_58;
  ulong local_50;
  char *local_48;
  BitmapArray<long> *local_40;
  value_type local_38;
  
  pBVar4 = buf.array_;
  local_60 = PA.pos_;
  local_40 = PA.array_;
  first1.pos_ = (pos_type)last.array_;
  first1.array_ = (BitmapArray<long> *)middle.pos_;
  first2.pos_ = (pos_type)in_stack_ffffffffffffff50;
  first2.array_ = in_stack_ffffffffffffff48;
  last1.pos_ = (pos_type)pBVar4;
  last1.array_ = (BitmapArray<long> *)last.pos_;
  local_48 = T;
  local_38 = depth;
  helper::vecswap<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
            ((helper *)middle.array_,first1,last1,first2);
  uVar9 = ~middle.pos_ + buf.pos_ + last.pos_;
  local_70 = buf.pos_;
  (*(pBVar4->super_Bitmap)._vptr_Bitmap[5])(pBVar4,uVar9);
  local_80 = pBVar4;
  iVar1 = (*(pBVar4->super_Bitmap)._vptr_Bitmap[5])(pBVar4,uVar9);
  local_78 = CONCAT44(extraout_var_00,iVar1);
  local_50 = (long)(int)extraout_var >> 0x1f;
  uVar7 = middle.pos_ - 1;
  (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,uVar7);
  local_88 = uVar9;
  if (extraout_var_01 < 0) {
    local_90 = (ulong)(extraout_var >> 0x1f | 2);
    iVar1 = (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,uVar7);
    uVar9 = ~CONCAT44(extraout_var_03,iVar1);
  }
  else {
    local_90 = (ulong)(extraout_var >> 0x1f);
    iVar1 = (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,uVar7);
    uVar9 = CONCAT44(extraout_var_02,iVar1);
  }
  uVar5 = local_78 ^ local_50;
  pVar2 = uVar9 + local_60;
  uVar9 = last.pos_ - 1;
  local_68 = last.array_;
  iVar1 = (*((last.array_)->super_Bitmap)._vptr_Bitmap[5])(last.array_,uVar9);
  local_58 = CONCAT44(extraout_var_04,iVar1);
  local_78 = pVar2;
LAB_0010b0c2:
  do {
    local_50 = first.pos_;
    pVar2 = local_78;
    local_78 = uVar5 + local_60;
    while( true ) {
      p1.pos_ = local_78;
      p1.array_ = local_40;
      p2.pos_ = pVar2;
      p2.array_ = local_40;
      iVar1 = compare<char*,bitmap::BitmapArray<long>::iterator>(local_48,p1,p2,local_38);
      pBVar4 = local_68;
      if (0 < iVar1) goto LAB_0010b210;
      if (-1 < iVar1) break;
      uVar5 = uVar7;
      local_a0.pos_ = uVar9;
      uVar8 = uVar9;
      if ((local_90 & 2) != 0) {
        do {
          local_a0.array_ = pBVar4;
          uVar8 = local_a0.pos_ - 1;
          bitmap::BitmapArray<long>::value_reference::operator=
                    (&local_a0,(value_reference *)&stack0xffffffffffffff50);
          local_a0.array_ = middle.array_;
          uVar7 = uVar5 - 1;
          local_a0.pos_ = uVar5;
          bitmap::BitmapArray<long>::value_reference::operator=
                    (&local_a0,(value_reference *)&stack0xffffffffffffff50);
          (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,uVar7);
          uVar5 = uVar7;
          local_a0.pos_ = uVar8;
        } while (extraout_var_05 < 0);
        local_90 = (ulong)((uint)local_90 & 0xfffffffd);
      }
      local_a0.array_ = pBVar4;
      uVar9 = uVar8 - 1;
      local_a0.pos_ = uVar8;
      bitmap::BitmapArray<long>::value_reference::operator=
                (&local_a0,(value_reference *)&stack0xffffffffffffff50);
      local_a0.array_ = middle.array_;
      local_a0.pos_ = uVar7;
      bitmap::BitmapArray<long>::value_reference::operator=
                (&local_a0,(value_reference *)&stack0xffffffffffffff50);
      pBVar6 = local_80;
      if (uVar7 <= local_50) {
        local_a0.pos_ = uVar9;
        for (uVar7 = local_88; local_70 < uVar7; uVar7 = uVar7 - 1) {
          local_a0.array_ = pBVar4;
          uVar9 = local_a0.pos_ - 1;
          bitmap::BitmapArray<long>::value_reference::operator=
                    (&local_a0,(value_reference *)&stack0xffffffffffffff50);
          local_a0.array_ = pBVar6;
          local_a0.pos_ = uVar7;
          bitmap::BitmapArray<long>::value_reference::operator=
                    (&local_a0,(value_reference *)&stack0xffffffffffffff50);
          local_a0.pos_ = uVar9;
        }
        goto LAB_0010b6cf;
      }
      uVar7 = uVar7 - 1;
      (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,uVar7);
      if (extraout_var_06 < 0) {
        local_90 = (ulong)((uint)local_90 | 2);
        iVar1 = (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,uVar7);
        uVar5 = ~CONCAT44(extraout_var_08,iVar1);
      }
      else {
        iVar1 = (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,uVar7);
        uVar5 = CONCAT44(extraout_var_07,iVar1);
      }
      pVar2 = uVar5 + local_60;
    }
    uVar5 = uVar9;
    uVar8 = local_88;
    if ((local_90 & 1) != 0) {
      do {
        pBVar6 = local_80;
        uVar5 = uVar9 - 1;
        local_a0.array_ = pBVar4;
        local_a0.pos_ = uVar9;
        bitmap::BitmapArray<long>::value_reference::operator=
                  (&local_a0,(value_reference *)&stack0xffffffffffffff50);
        pBVar4 = local_68;
        local_a0.array_ = pBVar6;
        uVar10 = uVar8 - 1;
        local_a0.pos_ = uVar8;
        bitmap::BitmapArray<long>::value_reference::operator=
                  (&local_a0,(value_reference *)&stack0xffffffffffffff50);
        (*(pBVar6->super_Bitmap)._vptr_Bitmap[5])(pBVar6,uVar10);
        uVar9 = uVar5;
        uVar8 = uVar10;
      } while (extraout_var_12 < 0);
      local_90 = (ulong)((uint)local_90 & 0xfffffffe);
      local_88 = uVar10;
    }
    iVar1 = (*(local_80->super_Bitmap)._vptr_Bitmap[5])(local_80,local_88);
    pVar2 = uVar5 - 1;
    (*(pBVar4->super_Bitmap)._vptr_Bitmap[4])(pBVar4,uVar5,~CONCAT44(extraout_var_13,iVar1));
    uVar9 = local_88;
    local_a0.array_ = local_80;
    local_a0.pos_ = local_88;
    bitmap::BitmapArray<long>::value_reference::operator=
              (&local_a0,(value_reference *)&stack0xffffffffffffff50);
    if (uVar9 <= local_70) {
      pp_Var3 = (local_80->super_Bitmap)._vptr_Bitmap;
      pBVar6 = local_80;
      goto LAB_0010b6f7;
    }
    if ((local_90 & 2) != 0) {
      uVar9 = uVar7;
      local_a0.pos_ = pVar2;
      do {
        pVar2 = local_a0.pos_ - 1;
        local_a0.array_ = pBVar4;
        bitmap::BitmapArray<long>::value_reference::operator=
                  (&local_a0,(value_reference *)&stack0xffffffffffffff50);
        local_a0.array_ = middle.array_;
        uVar7 = uVar9 - 1;
        local_a0.pos_ = uVar9;
        bitmap::BitmapArray<long>::value_reference::operator=
                  (&local_a0,(value_reference *)&stack0xffffffffffffff50);
        (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,uVar7);
        uVar9 = uVar7;
        local_a0.pos_ = pVar2;
      } while (extraout_var_14 < 0);
      local_90 = (ulong)((uint)local_90 & 0xfffffffd);
    }
    local_88 = local_88 - 1;
    uVar9 = pVar2 - 1;
    local_a0.array_ = pBVar4;
    local_a0.pos_ = pVar2;
    bitmap::BitmapArray<long>::value_reference::operator=
              (&local_a0,(value_reference *)&stack0xffffffffffffff50);
    local_a0.array_ = middle.array_;
    local_a0.pos_ = uVar7;
    bitmap::BitmapArray<long>::value_reference::operator=
              (&local_a0,(value_reference *)&stack0xffffffffffffff50);
    pBVar6 = local_80;
    uVar5 = local_88;
    if (uVar7 <= first.pos_) {
      local_a0.pos_ = uVar9;
      for (uVar7 = local_88; local_70 < uVar7; uVar7 = uVar7 - 1) {
        uVar9 = local_a0.pos_ - 1;
        local_a0.array_ = pBVar4;
        bitmap::BitmapArray<long>::value_reference::operator=
                  (&local_a0,(value_reference *)&stack0xffffffffffffff50);
        local_a0.array_ = pBVar6;
        local_a0.pos_ = uVar7;
        bitmap::BitmapArray<long>::value_reference::operator=
                  (&local_a0,(value_reference *)&stack0xffffffffffffff50);
        local_a0.pos_ = uVar9;
      }
LAB_0010b6cf:
      pBVar6 = local_80;
      local_a0.array_ = pBVar4;
      bitmap::BitmapArray<long>::value_reference::operator=
                (&local_a0,(value_reference *)&stack0xffffffffffffff50);
      pp_Var3 = (pBVar6->super_Bitmap)._vptr_Bitmap;
      goto LAB_0010b6f7;
    }
    (*(local_80->super_Bitmap)._vptr_Bitmap[5])(local_80,local_88);
    if (extraout_var_15 < 0) {
      local_90 = (ulong)((uint)local_90 | 1);
      iVar1 = (*(pBVar6->super_Bitmap)._vptr_Bitmap[5])(pBVar6,uVar5);
      local_78 = ~CONCAT44(extraout_var_18,iVar1);
    }
    else {
      iVar1 = (*(pBVar6->super_Bitmap)._vptr_Bitmap[5])(pBVar6,uVar5);
      local_78 = CONCAT44(extraout_var_16,iVar1);
    }
    uVar7 = uVar7 - 1;
    (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,uVar7);
    if (extraout_var_19 < 0) {
      local_90 = (ulong)((uint)local_90 | 2);
      iVar1 = (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,uVar7);
      uVar8 = ~CONCAT44(extraout_var_21,iVar1);
    }
    else {
      iVar1 = (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,uVar7);
      uVar8 = CONCAT44(extraout_var_20,iVar1);
    }
    uVar5 = local_78;
    local_78 = uVar8 + local_60;
  } while( true );
LAB_0010b210:
  uVar5 = uVar9;
  uVar8 = local_88;
  local_78 = pVar2;
  if ((local_90 & 1) != 0) {
    do {
      pBVar4 = local_80;
      local_a0.array_ = local_68;
      uVar5 = uVar9 - 1;
      local_a0.pos_ = uVar9;
      bitmap::BitmapArray<long>::value_reference::operator=
                (&local_a0,(value_reference *)&stack0xffffffffffffff50);
      local_a0.array_ = pBVar4;
      uVar10 = uVar8 - 1;
      local_a0.pos_ = uVar8;
      bitmap::BitmapArray<long>::value_reference::operator=
                (&local_a0,(value_reference *)&stack0xffffffffffffff50);
      (*(pBVar4->super_Bitmap)._vptr_Bitmap[5])(pBVar4,uVar10);
      uVar9 = uVar5;
      uVar8 = uVar10;
    } while (extraout_var_09 < 0);
    local_90 = (ulong)((uint)local_90 & 0xfffffffe);
    local_88 = uVar10;
  }
  pBVar6 = local_80;
  uVar8 = local_88;
  local_a0.array_ = local_68;
  uVar9 = uVar5 - 1;
  local_a0.pos_ = uVar5;
  bitmap::BitmapArray<long>::value_reference::operator=
            (&local_a0,(value_reference *)&stack0xffffffffffffff50);
  local_a0.array_ = pBVar6;
  local_a0.pos_ = uVar8;
  bitmap::BitmapArray<long>::value_reference::operator=
            (&local_a0,(value_reference *)&stack0xffffffffffffff50);
  if (uVar8 <= local_70) {
    pp_Var3 = (pBVar6->super_Bitmap)._vptr_Bitmap;
LAB_0010b6f7:
    (*pp_Var3[4])(pBVar6,local_70,local_58);
    return;
  }
  uVar8 = uVar8 - 1;
  (*(pBVar6->super_Bitmap)._vptr_Bitmap[5])(pBVar6,uVar8);
  local_88 = uVar8;
  if (extraout_var_10 < 0) {
    local_90 = (ulong)((uint)local_90 | 1);
    iVar1 = (*(pBVar6->super_Bitmap)._vptr_Bitmap[5])(pBVar6,uVar8);
    uVar5 = ~CONCAT44(extraout_var_17,iVar1);
  }
  else {
    iVar1 = (*(pBVar6->super_Bitmap)._vptr_Bitmap[5])(pBVar6,uVar8);
    uVar5 = CONCAT44(extraout_var_11,iVar1);
  }
  goto LAB_0010b0c2;
}

Assistant:

void merge_backward(
    const StringIterator_type T, const SAIterator_type PA, BufIterator_type buf,
    SAIterator_type first, SAIterator_type middle, SAIterator_type last,
    typename std::iterator_traits<SAIterator_type>::value_type depth) {
  SAIterator_type p1, p2;
  SAIterator_type i, k;
  BufIterator_type j, bufend;
  typename std::iterator_traits<SAIterator_type>::value_type t;
  int r, x;

  bufend = buf + (last - middle);
  helper::vecswap(middle, last, buf);

  x = 0;
  if (*(bufend - 1) < 0) {
    x |= 1;
    p1 = PA + ~*(bufend - 1);
  } else {
    p1 = PA + *(bufend - 1);
  }
  if (*(middle - 1) < 0) {
    x |= 2;
    p2 = PA + ~*(middle - 1);
  } else {
    p2 = PA + *(middle - 1);
  }
  for (t = *(last - 1), i = last - 1, j = bufend - 1, k = middle - 1;;) {

    r = compare(T, p1, p2, depth);
    if (r > 0) {
      if (x & 1) {
        do {
          *i-- = *j;
          *j-- = *i;
        } while (*j < 0);
        x ^= 1;
      }
      *i-- = *j;
      *j = *i;
      if (j <= buf) {
        *buf = t;
        return;
      }

      if (*--j < 0) {
        x |= 1;
        p1 = PA + ~*j;
      } else {
        p1 = PA + *j;
      }
    } else if (r < 0) {
      if (x & 2) {
        do {
          *i-- = *k;
          *k-- = *i;
        } while (*k < 0);
        x ^= 2;
      }
      *i-- = *k;
      *k = *i;
      if (k <= first) {
        while (buf < j) {
          *i-- = *j;
          *j-- = *i;
        }
        *i = *j, *buf = t;
        return;
      }

      if (*--k < 0) {
        x |= 2;
        p2 = PA + ~*k;
      } else {
        p2 = PA + *k;
      }
    } else {
      if (x & 1) {
        do {
          *i-- = *j;
          *j-- = *i;
        } while (*j < 0);
        x ^= 1;
      }
      *i-- = ~*j;
      *j = *i;
      if (j <= buf) {
        *buf = t;
        return;
      }
      --j;

      if (x & 2) {
        do {
          *i-- = *k;
          *k-- = *i;
        } while (*k < 0);
        x ^= 2;
      }
      *i-- = *k;
      *k = *i;
      if (k <= first) {
        while (buf < j) {
          *i-- = *j;
          *j-- = *i;
        }
        *i = *j, *buf = t;
        return;
      }
      --k;

      if (*j < 0) {
        x |= 1;
        p1 = PA + ~*j;
      } else {
        p1 = PA + *j;
      }
      if (*k < 0) {
        x |= 2;
        p2 = PA + ~*k;
      } else {
        p2 = PA + *k;
      }
    }
  }
}